

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.h
# Opt level: O2

bool __thiscall Memory::Recycler::HasPendingMarkObjects(Recycler *this)

{
  bool bVar1;
  
  bVar1 = MarkContext::HasPendingMarkObjects(&this->markContext);
  if (!bVar1) {
    bVar1 = MarkContext::HasPendingMarkObjects(&this->parallelMarkContext1);
    if (!bVar1) {
      bVar1 = MarkContext::HasPendingMarkObjects(&this->parallelMarkContext2);
      if (!bVar1) {
        bVar1 = MarkContext::HasPendingMarkObjects(&this->parallelMarkContext3);
        return bVar1;
      }
    }
  }
  return true;
}

Assistant:

bool HasPendingMarkObjects() const { return markContext.HasPendingMarkObjects() || parallelMarkContext1.HasPendingMarkObjects() || parallelMarkContext2.HasPendingMarkObjects() || parallelMarkContext3.HasPendingMarkObjects(); }